

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_2e03bb::Db::parseUnresolvedName(Db *this)

{
  short *psVar1;
  char *pcVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *pNVar5;
  short *psVar6;
  bool bVar7;
  
  psVar6 = (short *)this->First;
  psVar1 = (short *)this->Last;
  if (((ulong)((long)psVar1 - (long)psVar6) < 3) || ((char)psVar6[1] != 'N' || *psVar6 != 0x7273)) {
    psVar6 = (short *)this->First;
    if ((ulong)((long)psVar1 - (long)psVar6) < 2) {
      bVar7 = false;
    }
    else {
      bVar7 = *psVar6 == 0x7367;
    }
    if (bVar7) {
      this->First = (char *)(psVar6 + 1);
    }
    psVar6 = (short *)this->First;
    if (((ulong)((long)psVar1 - (long)psVar6) < 2) || (*psVar6 != 0x7273)) {
      pNVar3 = parseBaseUnresolvedName(this);
      if (!bVar7 || pNVar3 == (Node *)0x0) {
        return pNVar3;
      }
      pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
      pNVar4->K = KGlobalQualifiedName;
      pNVar4->RHSComponentCache = No;
      pNVar4->ArrayCache = No;
      pNVar4->FunctionCache = No;
      pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d4e88;
      pNVar4[1]._vptr_Node = (_func_int **)pNVar3;
      return pNVar4;
    }
    psVar6 = psVar6 + 1;
    this->First = (char *)psVar6;
    if ((psVar1 == psVar6) || (9 < (int)(char)*psVar6 - 0x30U)) {
      pNVar3 = parseUnresolvedType(this);
      if (pNVar3 != (Node *)0x0) {
        pNVar4 = pNVar3;
        if ((this->Last != this->First) && (*this->First == 'I')) {
          pNVar5 = parseTemplateArgs(this,false);
          if (pNVar5 == (Node *)0x0) {
            return (Node *)0x0;
          }
          pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
          pNVar4->K = KNameWithTemplateArgs;
          pNVar4->RHSComponentCache = No;
          pNVar4->ArrayCache = No;
          pNVar4->FunctionCache = No;
          pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d5670;
          pNVar4[1]._vptr_Node = (_func_int **)pNVar3;
          *(Node **)&pNVar4[1].K = pNVar5;
        }
LAB_00192441:
        pNVar3 = parseBaseUnresolvedName(this);
        if (pNVar3 != (Node *)0x0) {
          pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
          pNVar5->K = KQualifiedName;
          pNVar5->RHSComponentCache = No;
          pNVar5->ArrayCache = No;
          pNVar5->FunctionCache = No;
          pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d4d28;
          pNVar5[1]._vptr_Node = (_func_int **)pNVar4;
          *(Node **)&pNVar5[1].K = pNVar3;
          return pNVar5;
        }
      }
    }
    else {
      pNVar3 = parseSimpleId(this);
      if (pNVar3 != (Node *)0x0) {
        pNVar4 = (Node *)0x0;
        do {
          if (pNVar4 == (Node *)0x0) {
            pNVar4 = pNVar3;
            if (bVar7) {
              pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
              pNVar5->K = KGlobalQualifiedName;
              pNVar5->RHSComponentCache = No;
              pNVar5->ArrayCache = No;
              pNVar5->FunctionCache = No;
              pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d4e88;
              pNVar4 = pNVar5 + 1;
              goto LAB_0019235c;
            }
          }
          else {
            pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
            pNVar5->K = KQualifiedName;
            pNVar5->RHSComponentCache = No;
            pNVar5->ArrayCache = No;
            pNVar5->FunctionCache = No;
            pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d4d28;
            pNVar5[1]._vptr_Node = (_func_int **)pNVar4;
            pNVar4 = (Node *)&pNVar5[1].K;
LAB_0019235c:
            pNVar4->_vptr_Node = (_func_int **)pNVar3;
            pNVar4 = pNVar5;
          }
          pcVar2 = this->First;
          if ((pcVar2 != this->Last) && (*pcVar2 == 'E')) {
            this->First = pcVar2 + 1;
            goto LAB_00192441;
          }
          pNVar3 = parseSimpleId(this);
          if (pNVar3 == (Node *)0x0) {
            return (Node *)0x0;
          }
        } while( true );
      }
    }
  }
  else {
    this->First = (char *)((long)psVar6 + 3);
    pNVar3 = parseUnresolvedType(this);
    if (pNVar3 != (Node *)0x0) {
      pNVar4 = pNVar3;
      if ((this->Last != this->First) && (*this->First == 'I')) {
        pNVar5 = parseTemplateArgs(this,false);
        if (pNVar5 == (Node *)0x0) {
          return (Node *)0x0;
        }
        pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        pNVar4->K = KNameWithTemplateArgs;
        pNVar4->RHSComponentCache = No;
        pNVar4->ArrayCache = No;
        pNVar4->FunctionCache = No;
        pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d5670;
        pNVar4[1]._vptr_Node = (_func_int **)pNVar3;
        *(Node **)&pNVar4[1].K = pNVar5;
      }
      while ((pcVar2 = this->First, pcVar2 == this->Last || (*pcVar2 != 'E'))) {
        pNVar3 = parseSimpleId(this);
        if (pNVar3 == (Node *)0x0) {
          return (Node *)0x0;
        }
        pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        pNVar5->K = KQualifiedName;
        pNVar5->RHSComponentCache = No;
        pNVar5->ArrayCache = No;
        pNVar5->FunctionCache = No;
        pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d4d28;
        pNVar5[1]._vptr_Node = (_func_int **)pNVar4;
        *(Node **)&pNVar5[1].K = pNVar3;
        pNVar4 = pNVar5;
      }
      this->First = pcVar2 + 1;
      pNVar3 = parseBaseUnresolvedName(this);
      if (pNVar3 != (Node *)0x0) {
        pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        pNVar5->K = KQualifiedName;
        pNVar5->RHSComponentCache = No;
        pNVar5->ArrayCache = No;
        pNVar5->FunctionCache = No;
        pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d4d28;
        pNVar5[1]._vptr_Node = (_func_int **)pNVar4;
        *(Node **)&pNVar5[1].K = pNVar3;
        return pNVar5;
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseUnresolvedName() {
  Node *SoFar = nullptr;

  // srN <unresolved-type> [<template-args>] <unresolved-qualifier-level>* E <base-unresolved-name>
  // srN <unresolved-type>                   <unresolved-qualifier-level>+ E <base-unresolved-name>
  if (consumeIf("srN")) {
    SoFar = parseUnresolvedType();
    if (SoFar == nullptr)
      return nullptr;

    if (look() == 'I') {
      Node *TA = parseTemplateArgs();
      if (TA == nullptr)
        return nullptr;
      SoFar = make<NameWithTemplateArgs>(SoFar, TA);
    }

    while (!consumeIf('E')) {
      Node *Qual = parseSimpleId();
      if (Qual == nullptr)
        return nullptr;
      SoFar = make<QualifiedName>(SoFar, Qual);
    }

    Node *Base = parseBaseUnresolvedName();
    if (Base == nullptr)
      return nullptr;
    return make<QualifiedName>(SoFar, Base);
  }

  bool Global = consumeIf("gs");

  // [gs] <base-unresolved-name>                     # x or (with "gs") ::x
  if (!consumeIf("sr")) {
    SoFar = parseBaseUnresolvedName();
    if (SoFar == nullptr)
      return nullptr;
    if (Global)
      SoFar = make<GlobalQualifiedName>(SoFar);
    return SoFar;
  }

  // [gs] sr <unresolved-qualifier-level>+ E   <base-unresolved-name>
  if (std::isdigit(look())) {
    do {
      Node *Qual = parseSimpleId();
      if (Qual == nullptr)
        return nullptr;
      if (SoFar)
        SoFar = make<QualifiedName>(SoFar, Qual);
      else if (Global)
        SoFar = make<GlobalQualifiedName>(Qual);
      else
        SoFar = Qual;
    } while (!consumeIf('E'));
  }
  //      sr <unresolved-type>                 <base-unresolved-name>
  //      sr <unresolved-type> <template-args> <base-unresolved-name>
  else {
    SoFar = parseUnresolvedType();
    if (SoFar == nullptr)
      return nullptr;

    if (look() == 'I') {
      Node *TA = parseTemplateArgs();
      if (TA == nullptr)
        return nullptr;
      SoFar = make<NameWithTemplateArgs>(SoFar, TA);
    }
  }

  assert(SoFar != nullptr);

  Node *Base = parseBaseUnresolvedName();
  if (Base == nullptr)
    return nullptr;
  return make<QualifiedName>(SoFar, Base);
}